

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

Parser * __thiscall c4::yml::Parser::operator=(Parser *this,Parser *that)

{
  size_t sVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  bool bVar6;
  Parser *pPVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  char msg [76];
  char local_68 [24];
  char *pcStack_50;
  undefined8 local_48;
  undefined4 local_20;
  
  bVar11 = 0;
  _free(this);
  (this->m_options).flags = (that->m_options).flags;
  sVar1 = (that->m_file).len;
  (this->m_file).str = (that->m_file).str;
  (this->m_file).len = sVar1;
  sVar1 = (that->m_buf).len;
  (this->m_buf).str = (that->m_buf).str;
  (this->m_buf).len = sVar1;
  this->m_root_id = that->m_root_id;
  this->m_tree = that->m_tree;
  detail::stack<c4::yml::Parser::State,_16UL>::operator=(&this->m_stack,&that->m_stack);
  if ((this->m_stack).m_size == 0) {
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        pPVar7 = (Parser *)(*pcVar2)();
        return pPVar7;
      }
    }
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\\';
    local_68[9] = '\\';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_68[0x10] = '\0';
    local_68[0x11] = '\0';
    local_68[0x12] = '\0';
    local_68[0x13] = '\0';
    local_68[0x14] = '\0';
    local_68[0x15] = '\0';
    local_68[0x16] = '\0';
    local_68[0x17] = '\0';
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  this->m_state = (this->m_stack).m_stack + ((this->m_stack).m_size - 1);
  sVar1 = that->m_key_tag2_indentation;
  this->m_key_tag_indentation = that->m_key_tag_indentation;
  this->m_key_tag2_indentation = sVar1;
  sVar1 = (that->m_key_tag).len;
  (this->m_key_tag).str = (that->m_key_tag).str;
  (this->m_key_tag).len = sVar1;
  sVar1 = (that->m_key_tag2).len;
  (this->m_key_tag2).str = (that->m_key_tag2).str;
  (this->m_key_tag2).len = sVar1;
  this->m_val_tag_indentation = that->m_val_tag_indentation;
  sVar1 = (that->m_val_tag).len;
  (this->m_val_tag).str = (that->m_val_tag).str;
  (this->m_val_tag).len = sVar1;
  this->m_key_anchor_was_before = that->m_key_anchor_was_before;
  this->m_key_anchor_indentation = that->m_key_anchor_indentation;
  sVar1 = (that->m_key_anchor).len;
  (this->m_key_anchor).str = (that->m_key_anchor).str;
  (this->m_key_anchor).len = sVar1;
  this->m_val_anchor_indentation = that->m_val_anchor_indentation;
  sVar1 = (that->m_val_anchor).len;
  (this->m_val_anchor).str = (that->m_val_anchor).str;
  (this->m_val_anchor).len = sVar1;
  sVar1 = (that->m_filter_arena).len;
  if (sVar1 != 0) {
    _resize_filter_arena(this,sVar1);
  }
  if (this->m_newline_offsets_capacity < that->m_newline_offsets_capacity) {
    _resize_locations(this,that->m_newline_offsets_capacity);
  }
  if (this->m_newline_offsets_capacity < that->m_newline_offsets_capacity) {
    pcVar9 = "check failed: m_newline_offsets_capacity >= that.m_newline_offsets_capacity";
    pcVar10 = local_68;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(undefined8 *)pcVar10 = *(undefined8 *)pcVar9;
      pcVar9 = pcVar9 + ((ulong)bVar11 * -2 + 1) * 8;
      pcVar10 = pcVar10 + ((ulong)bVar11 * -2 + 1) * 8;
    }
    local_20 = 0x797469;
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        pPVar7 = (Parser *)(*pcVar2)();
        return pPVar7;
      }
    }
    auVar4 = ZEXT1224(ZEXT412(0x6b36) << 0x40);
    LVar3.name.str._0_4_ = 0x250b5d;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = 0;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_68,0x4c,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  if (this->m_newline_offsets_capacity < that->m_newline_offsets_size) {
    pcVar9 = "check failed: m_newline_offsets_capacity >= that.m_newline_offsets_size";
    pcVar10 = local_68;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(undefined8 *)pcVar10 = *(undefined8 *)pcVar9;
      pcVar9 = pcVar9 + ((ulong)bVar11 * -2 + 1) * 8;
      pcVar10 = pcVar10 + ((ulong)bVar11 * -2 + 1) * 8;
    }
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        pPVar7 = (Parser *)(*pcVar2)();
        return pPVar7;
      }
    }
    auVar4 = ZEXT1224(ZEXT412(0x6b37) << 0x40);
    LVar5.name.str._0_4_ = 0x250b5d;
    LVar5.super_LineCol.offset = auVar4._0_8_;
    LVar5.super_LineCol.line = auVar4._8_8_;
    LVar5.super_LineCol.col = auVar4._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_68,0x48,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  memcpy(this->m_newline_offsets,that->m_newline_offsets,that->m_newline_offsets_size << 3);
  this->m_newline_offsets_size = that->m_newline_offsets_size;
  sVar1 = (that->m_newline_offsets_buf).len;
  (this->m_newline_offsets_buf).str = (that->m_newline_offsets_buf).str;
  (this->m_newline_offsets_buf).len = sVar1;
  return this;
}

Assistant:

Parser& Parser::operator=(Parser const& that)
{
    _free();
    m_options = (that.m_options);
    m_file = (that.m_file);
    m_buf = (that.m_buf);
    m_root_id = (that.m_root_id);
    m_tree = (that.m_tree);
    m_stack = that.m_stack;
    m_state = &m_stack.top();
    m_key_tag_indentation = (that.m_key_tag_indentation);
    m_key_tag2_indentation = (that.m_key_tag2_indentation);
    m_key_tag = (that.m_key_tag);
    m_key_tag2 = (that.m_key_tag2);
    m_val_tag_indentation = (that.m_val_tag_indentation);
    m_val_tag = (that.m_val_tag);
    m_key_anchor_was_before = (that.m_key_anchor_was_before);
    m_key_anchor_indentation = (that.m_key_anchor_indentation);
    m_key_anchor = (that.m_key_anchor);
    m_val_anchor_indentation = (that.m_val_anchor_indentation);
    m_val_anchor = (that.m_val_anchor);
    if(that.m_filter_arena.len > 0)
        _resize_filter_arena(that.m_filter_arena.len);
    if(that.m_newline_offsets_capacity > m_newline_offsets_capacity)
        _resize_locations(that.m_newline_offsets_capacity);
    _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity >= that.m_newline_offsets_capacity);
    _RYML_CB_CHECK(m_stack.m_callbacks, m_newline_offsets_capacity >= that.m_newline_offsets_size);
    memcpy(m_newline_offsets, that.m_newline_offsets, that.m_newline_offsets_size * sizeof(size_t));
    m_newline_offsets_size = that.m_newline_offsets_size;
    m_newline_offsets_buf = that.m_newline_offsets_buf;
    return *this;
}